

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,int side)

{
  long lVar1;
  bool bVar2;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_10> local_60;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_60);
  pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_60);
  if (2 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x28);
  }
  if ((side == 2) && (this->fNeighbours[0].fGeoElIndex != -1)) {
LAB_00e73402:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (0 < local_60.super_TPZVec<int>.fNElements) {
      lVar1 = 0;
      do {
        if ((1 < local_60.super_TPZVec<int>.fStore[lVar1]) &&
           (this->fNeighbours[local_60.super_TPZVec<int>.fStore[lVar1] - 2].fGeoElIndex != -1))
        goto LAB_00e73402;
        lVar1 = lVar1 + 1;
      } while (local_60.super_TPZVec<int>.fNElements != lVar1);
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&local_60);
  return bVar2;
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}